

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

unsigned_long_long
ImGui::ScaleValueFromRatioT<unsigned_long_long,long_long,double>
          (ImGuiDataType data_type,float t,unsigned_long_long v_min,unsigned_long_long v_max,
          bool is_logarithmic,float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  unsigned_long_long uVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  float local_114;
  float local_10c;
  float local_d4;
  float local_c8;
  float local_c0;
  float local_b8;
  float local_b4;
  float local_ac;
  float local_a4;
  double local_a0;
  float local_94;
  float local_8c;
  double local_88;
  float local_80;
  float local_78;
  bool local_71;
  double v_new_off_f;
  float zero_point_snap_R;
  float zero_point_snap_L;
  float zero_point_center;
  float t_with_flip;
  double v_max_fudged;
  double v_min_fudged;
  unsigned_long_long uStack_40;
  bool flipped;
  unsigned_long_long result;
  float fStack_30;
  bool is_floating_point;
  float zero_deadzone_halfsize_local;
  float logarithmic_zero_epsilon_local;
  bool is_logarithmic_local;
  unsigned_long_long v_max_local;
  unsigned_long_long v_min_local;
  float t_local;
  ImGuiDataType data_type_local;
  
  _t_local = v_min;
  if (v_min != v_max) {
    local_71 = data_type == 8 || data_type == 9;
    result._3_1_ = local_71;
    result._4_4_ = zero_deadzone_halfsize;
    fStack_30 = logarithmic_zero_epsilon;
    zero_deadzone_halfsize_local._3_1_ = is_logarithmic;
    _logarithmic_zero_epsilon_local = v_max;
    v_max_local = v_min;
    v_min_local._0_4_ = t;
    v_min_local._4_4_ = data_type;
    if (is_logarithmic) {
      uStack_40 = v_min;
      if ((0.0 < t) && (uStack_40 = v_max, t < 1.0)) {
        v_min_fudged._7_1_ = v_max < v_min;
        auVar6._8_4_ = (int)(v_min >> 0x20);
        auVar6._0_8_ = v_min;
        auVar6._12_4_ = 0x45300000;
        dVar5 = ImAbs((auVar6._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)v_min) - 4503599627370496.0));
        if ((double)fStack_30 <= dVar5) {
          auVar7._8_4_ = (int)(v_max_local >> 0x20);
          auVar7._0_8_ = v_max_local;
          auVar7._12_4_ = 0x45300000;
          local_88 = (auVar7._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)v_max_local) - 4503599627370496.0);
        }
        else {
          local_78 = (float)v_max_local;
          if (0.0 <= local_78) {
            local_80 = fStack_30;
          }
          else {
            local_80 = -fStack_30;
          }
          local_88 = (double)local_80;
        }
        v_max_fudged = local_88;
        auVar8._8_4_ = (int)(_logarithmic_zero_epsilon_local >> 0x20);
        auVar8._0_8_ = _logarithmic_zero_epsilon_local;
        auVar8._12_4_ = 0x45300000;
        dVar5 = ImAbs((auVar8._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)_logarithmic_zero_epsilon_local) -
                      4503599627370496.0));
        if ((double)fStack_30 <= dVar5) {
          auVar9._8_4_ = (int)(_logarithmic_zero_epsilon_local >> 0x20);
          auVar9._0_8_ = _logarithmic_zero_epsilon_local;
          auVar9._12_4_ = 0x45300000;
          local_a0 = (auVar9._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)_logarithmic_zero_epsilon_local) -
                     4503599627370496.0);
        }
        else {
          local_8c = (float)_logarithmic_zero_epsilon_local;
          if (0.0 <= local_8c) {
            local_94 = fStack_30;
          }
          else {
            local_94 = -fStack_30;
          }
          local_a0 = (double)local_94;
        }
        _zero_point_center = local_a0;
        if ((v_min_fudged._7_1_ & 1) != 0) {
          ImSwap<double>(&v_max_fudged,(double *)&zero_point_center);
        }
        dVar5 = v_max_fudged;
        local_a4 = (float)_logarithmic_zero_epsilon_local;
        if (((local_a4 == 0.0) && (!NAN(local_a4))) &&
           (local_ac = (float)v_max_local, local_ac < 0.0)) {
          _zero_point_center = (double)-fStack_30;
        }
        dVar10 = _zero_point_center;
        if ((v_min_fudged._7_1_ & 1) == 0) {
          local_b4 = (float)v_min_local;
        }
        else {
          local_b4 = 1.0 - (float)v_min_local;
        }
        local_b8 = (float)(v_max_local * _logarithmic_zero_epsilon_local);
        if (0.0 <= local_b8) {
          local_10c = (float)v_max_local;
          if ((local_10c < 0.0) ||
             (local_114 = (float)_logarithmic_zero_epsilon_local, local_114 < 0.0)) {
            dVar5 = ImPow(v_max_fudged / _zero_point_center,(double)(1.0 - local_b4));
            uVar2 = (ulong)(dVar10 * dVar5);
            uStack_40 = uVar2 | (long)(dVar10 * dVar5 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f
            ;
          }
          else {
            dVar10 = ImPow(_zero_point_center / v_max_fudged,(double)local_b4);
            uVar2 = (ulong)(dVar5 * dVar10);
            uStack_40 = uVar2 | (long)(dVar5 * dVar10 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f
            ;
          }
        }
        else {
          uVar1 = ImMin<unsigned_long_long>(v_max_local,_logarithmic_zero_epsilon_local);
          local_c0 = (float)uVar1;
          local_c8 = (float)_logarithmic_zero_epsilon_local;
          local_d4 = (float)v_max_local;
          fVar3 = ImAbs(local_c8 - local_d4);
          fVar3 = -local_c0 / fVar3;
          fVar4 = fVar3 + result._4_4_;
          if ((local_b4 < fVar3 - result._4_4_) || (fVar4 < local_b4)) {
            if (fVar3 <= local_b4) {
              dVar10 = (double)fStack_30;
              dVar5 = ImPow(_zero_point_center / dVar10,(double)((local_b4 - fVar4) / (1.0 - fVar4))
                           );
              dVar10 = dVar10 * dVar5;
              uVar2 = (ulong)dVar10;
              uStack_40 = uVar2 | (long)(dVar10 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
            }
            else {
              dVar10 = (double)fStack_30;
              dVar5 = ImPow(-v_max_fudged / dVar10,(double)(1.0 - local_b4 / (fVar3 - result._4_4_))
                           );
              dVar5 = -(dVar10 * dVar5);
              uVar2 = (ulong)dVar5;
              uStack_40 = uVar2 | (long)(dVar5 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
            }
          }
          else {
            uStack_40 = 0;
          }
        }
      }
    }
    else if (data_type == 8 || data_type == 9) {
      uStack_40 = ImLerp<unsigned_long_long>(v_min,v_max,t);
    }
    else {
      uStack_40 = v_max;
      if (t < 1.0) {
        fVar3 = -0.5;
        if (v_min <= v_max) {
          fVar3 = 0.5;
        }
        uStack_40 = v_min + (long)((float)(long)(v_max - v_min) * t + fVar3);
      }
    }
    _t_local = uStack_40;
  }
  return _t_local;
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return v_min;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    TYPE result;
    if (is_logarithmic)
    {
        // We special-case the extents because otherwise our fudging can lead to "mathematically correct" but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value
        if (t <= 0.0f)
            result = v_min;
        else if (t >= 1.0f)
            result = v_max;
        else
        {
            bool flipped = v_max < v_min; // Check if range is "backwards"

            // Fudge min/max to avoid getting silly results close to zero
            FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
            FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

            if (flipped)
                ImSwap(v_min_fudged, v_max_fudged);

            // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
            if ((v_max == 0.0f) && (v_min < 0.0f))
                v_max_fudged = -logarithmic_zero_epsilon;

            float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

            if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
            {
                float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
                float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
                float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
                if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                    result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
                else if (t_with_flip < zero_point_center)
                    result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
                else
                    result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
            }
            else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
                result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
            else
                result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
        }
    }
    else
    {
        // Linear slider
        if (is_floating_point)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            if (t < 1.0)
            {
                FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
                result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
            }
            else
            {
                result = v_max;
            }
        }
    }

    return result;
}